

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_0::MembraneResponseHook::~MembraneResponseHook(MembraneResponseHook *this)

{
  MembraneResponseHook *this_local;
  
  ~MembraneResponseHook(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

MembraneResponseHook(
      kj::Own<ResponseHook>&& inner, kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), capTable(*this->policy, reverse) {}